

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O1

void __thiscall
FIX::HttpConnection::processResetSessions
          (HttpConnection *this,HttpMessage *request,stringstream *h,stringstream *b)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Parameters *this_00;
  _func_int **pp_Var2;
  undefined *puVar3;
  int iVar4;
  const_iterator cVar5;
  string *psVar6;
  Session *this_01;
  A *pAVar7;
  long *plVar8;
  size_t sVar9;
  _func_int **pp_Var10;
  ostream *poVar11;
  bool bVar12;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar13;
  HttpMessage copy;
  H2 h2;
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> sessions;
  A a;
  string local_618;
  stringstream *local_5f8;
  long *local_5f0;
  long local_5e8;
  long local_5e0 [2];
  stringstream *local_5d0;
  string local_5c8;
  HttpMessage local_5a8;
  undefined1 local_558 [432];
  ostream *local_3a8;
  undefined1 local_3a0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388 [25];
  ostream *local_1f0;
  undefined1 local_1e8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1d0 [26];
  
  local_5f8 = b;
  HttpMessage::HttpMessage(&local_5a8,request);
  local_3a0._0_8_ = local_3a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"confirm","");
  this_00 = &local_5a8.m_parameters;
  local_5d0 = h;
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_3a0);
  if ((_Rb_tree_header *)cVar5._M_node == &local_5a8.m_parameters._M_t._M_impl.super__Rb_tree_header
     ) {
    bVar12 = false;
  }
  else {
    local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"confirm","");
    psVar6 = HttpMessage::getParameter(&local_5a8,&local_5c8);
    iVar4 = std::__cxx11::string::compare((char *)psVar6);
    bVar12 = iVar4 != 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
      operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
    operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
  }
  if (bVar12) {
    Session::getSessions();
    for (; (_Rb_tree_node_base *)local_388[0]._0_8_ != (_Rb_tree_node_base *)(local_3a0 + 8);
        local_388[0]._0_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_388[0]._0_8_)) {
      this_01 = Session::lookupSession((SessionID *)(local_388[0]._0_8_ + 0x20));
      Session::reset(this_01);
    }
    local_558._0_8_ = local_558 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_558,"confirm","");
    pVar13 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::equal_range(&this_00->_M_t,(key_type *)local_558);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar13.first._M_node,(_Base_ptr)pVar13.second._M_node);
    if ((undefined1 *)local_558._0_8_ != local_558 + 0x10) {
      operator_delete((void *)local_558._0_8_,local_558._16_8_ + 1);
    }
    std::
    _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
    ::~_Rb_tree((_Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
                 *)local_3a0);
    if (bVar12) {
      poVar11 = (ostream *)(local_5d0 + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,"<META http-equiv=\'refresh\' content=2;URL=\'",0x2a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"/\'>",3);
      poVar11 = (ostream *)(local_5f8 + 0x10);
      HTML::CENTER::CENTER((CENTER *)local_3a0,poVar11);
      std::__ostream_insert<char,std::char_traits<char>>(local_1f0,">",1);
      HTML::H2::H2((H2 *)local_558,poVar11);
      std::__ostream_insert<char,std::char_traits<char>>(local_3a8,">",1);
      HTML::A::A((A *)local_1e8,poVar11);
      local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"/","");
      pAVar7 = HTML::A::href((A *)local_1e8,&local_618);
      local_5f0 = local_5e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f0,"Sessions","");
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(pAVar7->super_TAG).field_0x38,(char *)local_5f0,local_5e8);
      std::__ostream_insert<char,std::char_traits<char>>((pAVar7->super_TAG).m_stream,">",1);
      if (local_5f0 != local_5e0) {
        operator_delete(local_5f0,local_5e0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._M_dataplus._M_p != &local_618.field_2) {
        operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
      }
      HTML::TAG::~TAG((TAG *)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," have been reset",0x10);
      HTML::TAG::~TAG((TAG *)local_558);
      goto LAB_00176f0b;
    }
  }
  poVar11 = (ostream *)(local_5f8 + 0x10);
  HTML::CENTER::CENTER((CENTER *)local_3a0,poVar11);
  std::__ostream_insert<char,std::char_traits<char>>(local_1f0,">",1);
  HTML::H2::H2((H2 *)local_558,poVar11);
  std::__ostream_insert<char,std::char_traits<char>>(local_3a8,">",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,"Are you sure you want to reset all sessions ?",0x2d);
  HTML::TAG::~TAG((TAG *)local_558);
  HTML::TAG::~TAG((TAG *)local_3a0);
  HTML::CENTER::CENTER((CENTER *)local_3a0,poVar11);
  std::__ostream_insert<char,std::char_traits<char>>(local_1f0,">",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"[",1);
  HTML::A::A((A *)local_558,poVar11);
  HttpMessage::toString_abi_cxx11_(&local_618,request);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_618);
  pp_Var2 = (_func_int **)(local_1e8 + 0x10);
  pp_Var10 = (_func_int **)(plVar8 + 2);
  if ((_func_int **)*plVar8 == pp_Var10) {
    local_1e8._16_8_ = *pp_Var10;
    aaStack_1d0[0]._0_8_ = plVar8[3];
    local_1e8._0_8_ = pp_Var2;
  }
  else {
    local_1e8._16_8_ = *pp_Var10;
    local_1e8._0_8_ = (_func_int **)*plVar8;
  }
  local_1e8._8_8_ = plVar8[1];
  *plVar8 = (long)pp_Var10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  pAVar7 = HTML::A::href((A *)local_558,(string *)local_1e8);
  local_5f0 = local_5e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f0,"YES, reset sessions","");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(pAVar7->super_TAG).field_0x38,(char *)local_5f0,local_5e8);
  std::__ostream_insert<char,std::char_traits<char>>((pAVar7->super_TAG).m_stream,">",1);
  if (local_5f0 != local_5e0) {
    operator_delete(local_5f0,local_5e0[0] + 1);
  }
  if ((_func_int **)local_1e8._0_8_ != pp_Var2) {
    operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
  }
  paVar1 = &local_618.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar1) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  HTML::TAG::~TAG((TAG *)local_558);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]",1);
  puVar3 = HTML::NBSP;
  if (HTML::NBSP == (undefined *)0x0) {
    std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
  }
  else {
    sVar9 = strlen(HTML::NBSP);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,puVar3,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"[",1);
  HTML::A::A((A *)local_558,poVar11);
  local_1e8._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"/","");
  pAVar7 = HTML::A::href((A *)local_558,(string *)local_1e8);
  local_618._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_618,"NO, do not reset sessions","");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(pAVar7->super_TAG).field_0x38,local_618._M_dataplus._M_p,
             local_618._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((pAVar7->super_TAG).m_stream,">",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar1) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((_func_int **)local_1e8._0_8_ != pp_Var2) {
    operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
  }
  HTML::TAG::~TAG((TAG *)local_558);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]",1);
LAB_00176f0b:
  HTML::TAG::~TAG((TAG *)local_3a0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&this_00->_M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8.m_root._M_dataplus._M_p != &local_5a8.m_root.field_2) {
    operator_delete(local_5a8.m_root._M_dataplus._M_p,
                    local_5a8.m_root.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void HttpConnection::processResetSessions
( const HttpMessage& request, std::stringstream& h, std::stringstream& b )
{
  try
  {
    HttpMessage copy = request;

    bool confirm = false;
    if( copy.hasParameter("confirm") && copy.getParameter("confirm") != "0" )
    {
      confirm = true;
      std::set<SessionID> sessions = Session::getSessions();
      std::set<SessionID>::iterator session;
      for( session = sessions.begin(); session != sessions.end(); ++session )
      Session::lookupSession( *session )->reset();
      copy.removeParameter("confirm");
    }

    if( confirm )
    {
      h << "<META http-equiv='refresh' content=2;URL='" << "/'>";
      CENTER center(b); center.text();
      H2 h2(b); h2.text();
      { A a(b); a.href("/").text("Sessions"); }
      b << " have been reset";
    }
    else
    {
      { CENTER center(b); center.text();
        H2 h2(b); h2.text();
        b << "Are you sure you want to reset all sessions ?";
      }
      { CENTER center(b); center.text();
        b << "[";
        { A a(b); a.href(request.toString() + "?confirm=1").text("YES, reset sessions"); }
        b << "]" << NBSP << "[";
        { A a(b); a.href("/").text("NO, do not reset sessions"); }
        b << "]";
      }
    }
  }
  catch( std::exception& e )
  {
    b << e.what();
  }
}